

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::ConstructSourceFileFlags(cmGeneratorTarget *this)

{
  size_type sVar1;
  int iVar2;
  cmValue cVar3;
  mapped_type *pmVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *relFile;
  _Alloc_hider _Var5;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relFiles;
  cmSourceFile *sf;
  string local_58;
  cmSourceFile *local_38;
  
  if (this->SourceFileFlagsConstructed == false) {
    this->SourceFileFlagsConstructed = true;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"PUBLIC_HEADER","");
    cVar3 = GetProperty(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (cVar3.Value != (string *)0x0) {
      arg._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar3.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_58,arg,false);
      sVar1 = local_58._M_string_length;
      if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
        _Var5._M_p = local_58._M_dataplus._M_p;
        do {
          local_38 = cmMakefile::GetSource(this->Makefile,(string *)_Var5._M_p,Ambiguous);
          if (local_38 != (cmSourceFile *)0x0) {
            pmVar4 = std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::operator[](&this->SourceFlagsMap,&local_38);
            pmVar4->MacFolder = "Headers";
            pmVar4->Type = SourceFileTypePublicHeader;
          }
          _Var5._M_p = _Var5._M_p + 0x20;
        } while (_Var5._M_p != (pointer)sVar1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"PRIVATE_HEADER","");
    cVar3 = GetProperty(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (cVar3.Value != (string *)0x0) {
      arg_00._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
      arg_00._M_len = (cVar3.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_58,arg_00,false);
      sVar1 = local_58._M_string_length;
      if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
        _Var5._M_p = local_58._M_dataplus._M_p;
        do {
          local_38 = cmMakefile::GetSource(this->Makefile,(string *)_Var5._M_p,Ambiguous);
          if (local_38 != (cmSourceFile *)0x0) {
            pmVar4 = std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::operator[](&this->SourceFlagsMap,&local_38);
            pmVar4->MacFolder = "PrivateHeaders";
            pmVar4->Type = SourceFileTypePrivateHeader;
          }
          _Var5._M_p = _Var5._M_p + 0x20;
        } while (_Var5._M_p != (pointer)sVar1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"RESOURCE","");
    cVar3 = GetProperty(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (cVar3.Value != (string *)0x0) {
      arg_01._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
      arg_01._M_len = (cVar3.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_58,arg_01,false);
      if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
        _Var5._M_p = local_58._M_dataplus._M_p;
        do {
          local_38 = cmMakefile::GetSource(this->Makefile,(string *)_Var5._M_p,Ambiguous);
          if (local_38 != (cmSourceFile *)0x0) {
            pmVar4 = std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::operator[](&this->SourceFlagsMap,&local_38);
            pmVar4->MacFolder = "";
            iVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x30])
                              (this->GlobalGenerator,this->Makefile);
            if ((char)iVar2 == '\0') {
              pmVar4->MacFolder = "Resources";
            }
            pmVar4->Type = SourceFileTypeResource;
          }
          _Var5._M_p = _Var5._M_p + 0x20;
        } while (_Var5._M_p != (pointer)local_58._M_string_length);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::ConstructSourceFileFlags() const
{
  if (this->SourceFileFlagsConstructed) {
    return;
  }
  this->SourceFileFlagsConstructed = true;

  // Process public headers to mark the source files.
  if (cmValue files = this->GetProperty("PUBLIC_HEADER")) {
    std::vector<std::string> relFiles = cmExpandedList(*files);
    for (std::string const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "Headers";
        flags.Type = cmGeneratorTarget::SourceFileTypePublicHeader;
      }
    }
  }

  // Process private headers after public headers so that they take
  // precedence if a file is listed in both.
  if (cmValue files = this->GetProperty("PRIVATE_HEADER")) {
    std::vector<std::string> relFiles = cmExpandedList(*files);
    for (std::string const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "PrivateHeaders";
        flags.Type = cmGeneratorTarget::SourceFileTypePrivateHeader;
      }
    }
  }

  // Mark sources listed as resources.
  if (cmValue files = this->GetProperty("RESOURCE")) {
    std::vector<std::string> relFiles = cmExpandedList(*files);
    for (std::string const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "";
        if (!this->GlobalGenerator->ShouldStripResourcePath(this->Makefile)) {
          flags.MacFolder = "Resources";
        }
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
      }
    }
  }
}